

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void ModulusHelper<signed_char,_unsigned_short,_1>::
     ModulusThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (char *t,unsigned_short *u,char *result)

{
  bool bVar1;
  undefined1 *in_RDX;
  unsigned_short *in_RSI;
  char *in_RDI;
  
  if (*in_RSI == 0) {
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
  }
  bVar1 = mod_corner_case<unsigned_short,_false>::is_undefined(*in_RSI);
  if (bVar1) {
    *in_RDX = 0;
  }
  else {
    *in_RDX = (char)((int)*in_RDI % (int)(uint)*in_RSI);
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void ModulusThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
            E::SafeIntOnDivZero();

        //trap corner case
        if (mod_corner_case<U, std::numeric_limits< U >::is_signed >::is_undefined(u))
        {
            result = 0;
            return;
        }

        result = (T)(t % u);
    }